

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O1

int fp_tmpnam(char *suffix,char *rootname,char *tmpnam)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  char *msg;
  int iVar5;
  int iVar6;
  
  sVar2 = strlen(suffix);
  sVar3 = strlen(rootname);
  if (sVar3 + sVar2 < 0x1fd) {
    strcpy(tmpnam,rootname);
    strcat(tmpnam,suffix);
    sVar2 = strlen(tmpnam);
    iVar4 = 0x200 - (int)sVar2;
    iVar5 = 0;
    iVar6 = iVar5;
    if (0 < iVar4) {
      do {
        iVar1 = fp_access(tmpnam);
        iVar6 = iVar5;
        if (iVar1 != 0) break;
        sVar2 = strlen(tmpnam);
        if (0x1ff < sVar2) goto LAB_00103d3f;
        sVar2 = strlen(tmpnam);
        (tmpnam + sVar2)[0] = 'x';
        (tmpnam + sVar2)[1] = '\0';
        iVar5 = iVar5 + 1;
        iVar6 = iVar4;
      } while (iVar4 != iVar5);
    }
    if (iVar6 != iVar4) {
      return 0;
    }
LAB_00103d3f:
    fp_msg("\nCould not create temporary file name:\n");
    fp_msg(tmpnam);
    msg = "\n";
  }
  else {
    msg = "Error: filename is too long to create temporary file\n";
  }
  fp_msg(msg);
  exit(-1);
}

Assistant:

int fp_tmpnam(char *suffix, char *rootname, char *tmpnam)
{
	/* create temporary file name */

	int maxtry = 30, ii;

	if (strlen(suffix) + strlen(rootname) > SZ_STR-5) {
	    fp_msg ("Error: filename is too long to create temporary file\n"); exit (-1);
	}

	strcpy (tmpnam, rootname);  /* start with rootname */
	strcat(tmpnam, suffix);     /* append the suffix */

	maxtry = SZ_STR - strlen(tmpnam) - 1;

        for (ii = 0; ii < maxtry; ii++) {
		if (fp_access(tmpnam)) break;  /* good, the file does not exist */
                if (strlen(tmpnam) > SZ_STR-2)
                {
		   fp_msg ("\nCould not create temporary file name:\n");
		   fp_msg (tmpnam);
		   fp_msg ("\n");
		   exit (-1);
                }
		strcat(tmpnam, "x");  /* append an x to the name, and try again */
	}

	if (ii == maxtry) {
		fp_msg ("\nCould not create temporary file name:\n");
		fp_msg (tmpnam);
		fp_msg ("\n");
		exit (-1);
	}

        return(0);
}